

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.hpp
# Opt level: O1

unique_ptr<HawkTracer::client::CallgrindConverter,_std::default_delete<HawkTracer::client::CallgrindConverter>_>
 HawkTracer::parser::make_unique<HawkTracer::client::CallgrindConverter>(void)

{
  Converter *this;
  __uniq_ptr_data<HawkTracer::client::CallgrindConverter,_std::default_delete<HawkTracer::client::CallgrindConverter>,_true,_true>
  in_RDI;
  
  this = (Converter *)operator_new(0xb0);
  memset(this,0,0xb0);
  client::Converter::Converter(this);
  this->_vptr_Converter = (_func_int **)&PTR__CallgrindConverter_00117c20;
  this[1]._vptr_Converter = (_func_int **)&this[1]._mapping_klass_name;
  std::__cxx11::string::_M_construct<char_const*>((string *)(this + 1),"# callgrind format","");
  this[1]._mapping_klass_name.field_2._M_allocated_capacity = (size_type)&this[1]._mapping_klass_id;
  *(undefined8 *)((long)&this[1]._mapping_klass_name.field_2 + 8) = 0;
  *(undefined1 *)&this[1]._mapping_klass_id = 0;
  this[2]._tracepoint_map._M_t.
  super___uniq_ptr_impl<HawkTracer::client::TracepointMap,_std::default_delete<HawkTracer::client::TracepointMap>_>
  ._M_t.
  super__Tuple_impl<0UL,_HawkTracer::client::TracepointMap_*,_std::default_delete<HawkTracer::client::TracepointMap>_>
  .super__Head_base<0UL,_HawkTracer::client::TracepointMap_*,_false>._M_head_impl =
       (TracepointMap *)(this + 3);
  this[2]._mapping_klass_name._M_dataplus._M_p = (pointer)0x1;
  this[2]._mapping_klass_name._M_string_length = 0;
  this[2]._mapping_klass_name.field_2._M_allocated_capacity = 0;
  *(undefined4 *)((long)&this[2]._mapping_klass_name.field_2 + 8) = 0x3f800000;
  *(undefined8 *)&this[2]._mapping_klass_id = 0;
  this[3]._vptr_Converter = (_func_int **)0x0;
  *(Converter **)
   in_RDI.
   super___uniq_ptr_impl<HawkTracer::client::CallgrindConverter,_std::default_delete<HawkTracer::client::CallgrindConverter>_>
   ._M_t.
   super__Tuple_impl<0UL,_HawkTracer::client::CallgrindConverter_*,_std::default_delete<HawkTracer::client::CallgrindConverter>_>
   .super__Head_base<0UL,_HawkTracer::client::CallgrindConverter_*,_false>._M_head_impl = this;
  return (__uniq_ptr_data<HawkTracer::client::CallgrindConverter,_std::default_delete<HawkTracer::client::CallgrindConverter>,_true,_true>
          )(tuple<HawkTracer::client::CallgrindConverter_*,_std::default_delete<HawkTracer::client::CallgrindConverter>_>
            )in_RDI.
             super___uniq_ptr_impl<HawkTracer::client::CallgrindConverter,_std::default_delete<HawkTracer::client::CallgrindConverter>_>
             ._M_t.
             super__Tuple_impl<0UL,_HawkTracer::client::CallgrindConverter_*,_std::default_delete<HawkTracer::client::CallgrindConverter>_>
             .super__Head_base<0UL,_HawkTracer::client::CallgrindConverter_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> make_unique(Args&&... args)
{
    return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}